

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_arena.pb.cc
# Opt level: O0

void proto2_arena_unittest::ArenaMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ArenaMessage **v1;
  ArenaMessage **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedPtrField<proto2_arena_unittest::NestedMessage> *this;
  RepeatedPtrField<proto2_arena_unittest::NestedMessage> *other;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  ArenaMessage *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ArenaMessage *from;
  ArenaMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (ArenaMessage *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (ArenaMessage *)to_msg;
  _this = (ArenaMessage *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_arena_unittest::ArenaMessage_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_arena_unittest::ArenaMessage*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_arena_unittest::ArenaMessage_const*,proto2_arena_unittest::ArenaMessage*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_arena.pb.cc"
               ,0x24a,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = _internal_mutable_repeated_nested_message(from);
  other = _internal_repeated_nested_message((ArenaMessage *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedPtrField<proto2_arena_unittest::NestedMessage>::MergeFrom(this,other);
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void ArenaMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ArenaMessage*>(&to_msg);
  auto& from = static_cast<const ArenaMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_arena_unittest.ArenaMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}